

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void basic_suite::test_true(void)

{
  value vVar1;
  value_type input [1];
  decoder decoder;
  value local_5c;
  uchar local_55;
  undefined4 local_54;
  decoder local_50;
  
  local_50.input._M_str = &local_55;
  local_55 = 0x81;
  local_50.input._M_len = 1;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_5c = local_50.current.code;
  local_54 = 0x81;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x40,"void basic_suite::test_true()",&local_5c,&local_54);
  local_5c = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_54 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x41,"void basic_suite::test_true()",&local_5c,&local_54);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_5c = end;
  if (vVar1 - null < 0xc) {
    local_5c = *(value *)(&DAT_00124a00 + (ulong)(vVar1 - null) * 4);
  }
  local_54 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x42,"void basic_suite::test_true()",&local_5c,&local_54);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_5c = local_50.current.code;
  local_54 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x44,"void basic_suite::test_true()",&local_5c,&local_54);
  return;
}

Assistant:

void test_true()
{
    const value_type input[] = { token::code::true_value };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}